

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_set.c
# Opt level: O2

int mpt_config_set(mpt_config *conf,char *path,char *val,int sep,int end)

{
  undefined8 uVar1;
  int iVar2;
  mpt_metatype *pmVar3;
  mpt_config *conf_local;
  char *val_local;
  mpt_path where;
  mpt_value d;
  
  where.len = 0;
  where.first = '\0';
  where.flags = '\0';
  where.sep = '.';
  where.assign = '\0';
  where._28_4_ = 0;
  where.base = (char *)0x0;
  where.off = 0;
  conf_local = conf;
  val_local = val;
  if (conf == (mpt_config *)0x0) {
    pmVar3 = mpt_config_global((mpt_path *)0x0);
    if (pmVar3 == (mpt_metatype *)0x0) {
      return -4;
    }
    iVar2 = (*(pmVar3->_vptr->convertable).convert)((mpt_convertable *)pmVar3,0x85,&conf_local);
    if (iVar2 < 0) {
      return -4;
    }
    if (conf_local == (mpt_config *)0x0) {
      return -4;
    }
  }
  uVar1 = where._24_8_;
  if (path != (char *)0x0) {
    where.sep = (char)sep;
    where._28_4_ = SUB84(uVar1,4);
    where.assign = (char)end;
    mpt_path_set(&where,path,-1);
  }
  if (val == (char *)0x0) {
    iVar2 = (*conf_local->_vptr->remove)(conf_local,&where);
  }
  else {
    d._addr = &val_local;
    d._type = 0x73;
    iVar2 = (*conf_local->_vptr->assign)(conf_local,&where,&d);
  }
  return iVar2;
}

Assistant:

extern int mpt_config_set(MPT_INTERFACE(config) *conf, const char *path, const char *val, int sep, int end)
{
	MPT_STRUCT(path) where = MPT_PATH_INIT;
	
	if (!conf) {
		MPT_INTERFACE(metatype) *gl;
		if (!(gl = mpt_config_global(0))
		    || MPT_metatype_convert(gl, MPT_ENUM(TypeConfigPtr), &conf) < 0
		    || !conf) {
			return MPT_ERROR(BadOperation);
		}
	}
	if (path) {
		where.sep = sep;
		where.assign = end;
		(void) mpt_path_set(&where, path, -1);
	}
	if (!val) {
		return conf->_vptr->remove(conf, &where);
	}
	else {
		MPT_STRUCT(value) d = MPT_VALUE_INIT('s', &val);
		return conf->_vptr->assign(conf, &where, &d);
	}
}